

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_expectOneMemBufferParameterAndValueFailsDueToContents_Test::testBody
          (TEST_MockSupport_c_expectOneMemBufferParameterAndValueFailsDueToContents_Test *this)

{
  TestTestingFixture fixture;
  SimpleString SStack_48;
  TestTestingFixture local_38;
  
  TestTestingFixture::TestTestingFixture(&local_38);
  TestTestingFixture::setTestFunction(&local_38,failingCallToMockCWithMemoryBuffer_);
  TestTestingFixture::runAllTests(&local_38);
  SimpleString::SimpleString
            (&SStack_48,
             "Unexpected parameter value to parameter \"name\" to function \"bar\": <Size = 3 | HexContents = 12 05 FF>"
            );
  TestTestingFixture::assertPrintContains(&local_38,&SStack_48);
  SimpleString::~SimpleString(&SStack_48);
  TestTestingFixture::~TestTestingFixture(&local_38);
  return;
}

Assistant:

TEST(MockSupport_c, expectOneMemBufferParameterAndValueFailsDueToContents)
{
    TestTestingFixture fixture;
    fixture.setTestFunction(failingCallToMockCWithMemoryBuffer_);
    fixture.runAllTests();
    fixture.assertPrintContains("Unexpected parameter value to parameter \"name\" "
                                "to function \"bar\": <Size = 3 | HexContents = 12 05 FF>");
}